

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_load.hpp
# Opt level: O1

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_bool[5],_void>::load
               (iarchive *ar,bool (*data) [5],uint protocol_version)

{
  error *this;
  size_t i;
  long lVar1;
  bool value;
  size_t count;
  bool local_29;
  unsigned_long local_28;
  
  bintoken::iarchive::load<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::iarchive::load<unsigned_long>(ar,&local_28);
  if (local_28 == 5) {
    lVar1 = 0;
    do {
      bintoken::iarchive::load<bool>(ar,&local_29);
      (*data)[lVar1] = local_29;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    if ((ar->reader).decoder.current.code == end_array) {
      bintoken::iarchive::load<trial::protocol::bintoken::token::end_array>(ar);
      return;
    }
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,expected_end_array);
  }
  else {
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,incompatible_type);
  }
  __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
}

Assistant:

static void load(bintoken::iarchive& ar,
                     T (&data)[N],
                     const unsigned int protocol_version)
    {
        ar.load<bintoken::token::begin_array>();

        std::size_t count;
        ar.load_override(count, protocol_version);
        if (count != N)
            throw bintoken::error(bintoken::incompatible_type);

        for (std::size_t i = 0; i < N; ++i)
        {
            T value;
            ar >> value;
            data[i] = value;
        }
        if (!ar.at<bintoken::token::end_array>())
            throw bintoken::error(bintoken::expected_end_array);
        ar.load<bintoken::token::end_array>();
    }